

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SystemTimingCheckDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SystemTimingCheckDef>>>
::
nosize_unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>&&,slang::ast::SystemTimingCheckDef&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SystemTimingCheckDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SystemTimingCheckDef>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<std::basic_string_view<char,_std::char_traits<char>_>_&&,_slang::ast::SystemTimingCheckDef_&&>
          *args)

{
  group_type_pointer pgVar1;
  SystemTimingCheckDef *pSVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  SystemTimingCheckDef *pSVar5;
  ulong uVar6;
  uint uVar7;
  ushort uVar8;
  char *pcVar9;
  size_t sVar10;
  pointer pSVar11;
  undefined4 uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  pgVar3 = arrays_->groups_;
  lVar13 = pos0 * 0x10;
  pgVar1 = pgVar3 + pos0;
  auVar16[0] = -(pgVar1->m[0].n == '\0');
  auVar16[1] = -(pgVar1->m[1].n == '\0');
  auVar16[2] = -(pgVar1->m[2].n == '\0');
  auVar16[3] = -(pgVar1->m[3].n == '\0');
  auVar16[4] = -(pgVar1->m[4].n == '\0');
  auVar16[5] = -(pgVar1->m[5].n == '\0');
  auVar16[6] = -(pgVar1->m[6].n == '\0');
  auVar16[7] = -(pgVar1->m[7].n == '\0');
  auVar16[8] = -(pgVar1->m[8].n == '\0');
  auVar16[9] = -(pgVar1->m[9].n == '\0');
  auVar16[10] = -(pgVar1->m[10].n == '\0');
  auVar16[0xb] = -(pgVar1->m[0xb].n == '\0');
  auVar16[0xc] = -(pgVar1->m[0xc].n == '\0');
  auVar16[0xd] = -(pgVar1->m[0xd].n == '\0');
  auVar16[0xe] = -(pgVar1->m[0xe].n == '\0');
  auVar16[0xf] = -(pgVar1->m[0xf].n == '\0');
  uVar15 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
  if (uVar15 == 0) {
    uVar6 = arrays_->groups_size_mask;
    lVar14 = 1;
    do {
      pgVar3[pos0].m[0xf].n = pgVar3[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar14 & uVar6;
      lVar13 = pos0 * 0x10;
      pgVar1 = pgVar3 + pos0;
      auVar17[0] = -(pgVar1->m[0].n == '\0');
      auVar17[1] = -(pgVar1->m[1].n == '\0');
      auVar17[2] = -(pgVar1->m[2].n == '\0');
      auVar17[3] = -(pgVar1->m[3].n == '\0');
      auVar17[4] = -(pgVar1->m[4].n == '\0');
      auVar17[5] = -(pgVar1->m[5].n == '\0');
      auVar17[6] = -(pgVar1->m[6].n == '\0');
      auVar17[7] = -(pgVar1->m[7].n == '\0');
      auVar17[8] = -(pgVar1->m[8].n == '\0');
      auVar17[9] = -(pgVar1->m[9].n == '\0');
      auVar17[10] = -(pgVar1->m[10].n == '\0');
      auVar17[0xb] = -(pgVar1->m[0xb].n == '\0');
      auVar17[0xc] = -(pgVar1->m[0xc].n == '\0');
      auVar17[0xd] = -(pgVar1->m[0xd].n == '\0');
      auVar17[0xe] = -(pgVar1->m[0xe].n == '\0');
      auVar17[0xf] = -(pgVar1->m[0xf].n == '\0');
      uVar8 = (ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe;
      uVar15 = (uint)uVar8;
      lVar14 = lVar14 + 1;
    } while (uVar8 == 0);
  }
  uVar7 = 0;
  if (uVar15 != 0) {
    for (; (uVar15 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
    }
  }
  ppVar4 = arrays_->elements_;
  pcVar9 = args->first->_M_str;
  ppVar4[pos0 * 0xf + (ulong)uVar7].first._M_len = args->first->_M_len;
  ppVar4[pos0 * 0xf + (ulong)uVar7].first._M_str = pcVar9;
  pSVar5 = args->second;
  uVar12 = *(undefined4 *)&pSVar5->field_0x4;
  sVar10 = pSVar5->minArgs;
  pSVar2 = &ppVar4[pos0 * 0xf + (ulong)uVar7].second;
  pSVar2->kind = pSVar5->kind;
  *(undefined4 *)&pSVar2->field_0x4 = uVar12;
  pSVar2->minArgs = sVar10;
  pSVar11 = (pSVar5->args).
            super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppVar4[pos0 * 0xf + (ulong)uVar7].second.args.
  super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pSVar5->args).
       super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ppVar4[pos0 * 0xf + (ulong)uVar7].second.args.
  super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar11;
  ppVar4[pos0 * 0xf + (ulong)uVar7].second.args.
  super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pSVar5->args).
       super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pSVar5->args).
  super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar5->args).
  super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar5->args).
  super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pgVar3->m + lVar13)[uVar7].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + ((uint)hash & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(pgVar3->m + lVar13);
  __return_storage_ptr__->n = uVar7;
  __return_storage_ptr__->p = ppVar4 + pos0 * 0xf + (ulong)uVar7;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }